

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator%(sc_signed *__return_storage_ptr__,sc_signed *u,sc_unsigned *v)

{
  sc_length_param *psVar1;
  
  if (v->sgn == 0 || u->sgn == 0) {
    if (v->sgn == 0) {
      sc_core::sc_report_handler::report
                (SC_ERROR,"operation failed","div_by_zero<Type>( Type ) : division by zero",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/int/sc_nbutils.h"
                 ,0x2a8);
      sc_core::sc_abort();
    }
    psVar1 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar1->m_len);
  }
  else {
    mod_signed_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,v->nbits,v->ndigits
                      ,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator%(const sc_signed& u, const sc_unsigned& v)
{

  if ((u.sgn == SC_ZERO) || (v.sgn == SC_ZERO)) {
    div_by_zero(v.sgn);  // case 1
    return sc_signed();  // case 2
  }

  // other cases
  return mod_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           v.nbits, v.ndigits, v.digit);
}